

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSVparser.cpp
# Opt level: O3

ofstream * csv::operator<<(ofstream *os,Row *row)

{
  pointer pbVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  pbVar1 = (row->_values).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((row->_values).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar1) {
    uVar3 = 1;
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,pbVar1[uVar4]._M_dataplus._M_p,pbVar1[uVar4]._M_string_length);
      pbVar1 = (row->_values).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = (long)(row->_values).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
      if (uVar4 < uVar2 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,",",1);
        pbVar1 = (row->_values).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = (long)(row->_values).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
      }
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar4);
  }
  return os;
}

Assistant:

std::ofstream &operator<<(std::ofstream &os, const Row &row)
  {
    for (unsigned int i = 0; i != row._values.size(); i++)
    {
        os << row._values[i];
        if (i < row._values.size() - 1)
          os << ",";
    }
    return os;
  }